

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O3

bool __thiscall KeyValueFile::includeFile(KeyValueFile *this,char *inc_file_name,int include_depth)

{
  PrintErrorFunc p_Var1;
  pointer pcVar2;
  uint uVar3;
  pointer pSVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  ulong uVar9;
  long *plVar10;
  PrintErrorFunc p_Var11;
  char *pcVar12;
  StringKeyValue *value;
  pointer __x;
  string combinedFileName;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  undefined1 local_98 [16];
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_80;
  vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_> local_70;
  int local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (include_depth < 0x10) {
    pcVar2 = (this->fileName)._M_dataplus._M_p;
    uVar9 = (this->fileName)._M_string_length;
    uVar6 = (uint)uVar9;
    pcVar12 = pcVar2 + (uVar9 & 0xffffffff);
    while( true ) {
      pcVar12 = pcVar12 + -1;
      uVar7 = (uint)uVar9;
      uVar3 = (int)uVar6 >> 0x1f & uVar6;
      if ((int)uVar7 < 1) break;
      uVar9 = (ulong)(uVar7 - 1);
      uVar3 = uVar7;
      if ((*pcVar12 == '\\') || (*pcVar12 == '/')) break;
    }
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pcVar2,pcVar2 + (int)uVar3);
    std::__cxx11::string::append((char *)&local_b8);
    local_88 = 0;
    aStack_80._M_allocated_capacity._0_4_ = aStack_80._M_allocated_capacity._0_4_ & 0xffffff00;
    local_70.
    super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>.
    _M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
    local_70.
    super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>.
    _M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
    local_70.
    super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58 = include_depth + 1;
    local_98._0_8_ = this->printErrorFunc;
    local_98._8_8_ = &aStack_80;
    bVar5 = loadFromFile((KeyValueFile *)local_98,(char *)local_b8);
    pSVar4 = local_70.
             super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((bVar5) &&
       (local_70.
        super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_70.
        super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      __x = local_70.
            super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>::
        push_back(&this->kv,__x);
        __x = __x + 1;
      } while (__x != pSVar4);
    }
    std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>::
    ~vector(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._8_8_ != &aStack_80) {
      operator_delete((void *)local_98._8_8_);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
  }
  else {
    p_Var1 = this->printErrorFunc;
    if (p_Var1 != (PrintErrorFunc)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"ERROR: Maximum include depth exceeded on file \'","");
      plVar8 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar8[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar8;
      }
      local_b0 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
      p_Var11 = (PrintErrorFunc)(plVar8 + 2);
      if ((PrintErrorFunc)*plVar8 == p_Var11) {
        local_88 = *(size_type *)p_Var11;
        aStack_80._M_allocated_capacity._0_4_ = *(undefined4 *)(plVar8 + 3);
        aStack_80._M_allocated_capacity._4_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
        local_98._0_8_ = &local_88;
      }
      else {
        local_88 = *(size_type *)p_Var11;
        local_98._0_8_ = (PrintErrorFunc)*plVar8;
      }
      local_98._8_8_ = plVar8[1];
      *plVar8 = (long)p_Var11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      (*p_Var1)((char *)local_98._0_8_);
      if ((size_type *)local_98._0_8_ != &local_88) {
        operator_delete((void *)local_98._0_8_);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool includeFile(const char * inc_file_name, int include_depth)
  {
    if (include_depth >= 16)
    {
      if (printErrorFunc)
        printErrorFunc(
          (std::string("ERROR: Maximum include depth exceeded on file '") + inc_file_name + "'\n").c_str());
      return false;
    }

    int len = int(fileName.length()) - 1;
    while (len >= 0)
    {
      if (fileName[len] == '\\' || fileName[len] == '/')
        break;
      len--;
    }

    std::string combinedFileName(fileName.c_str(), len + 1);
    combinedFileName += inc_file_name;

    KeyValueFile kvFile;
    kvFile.includeDepth = include_depth + 1;
    kvFile.printErrorFunc = printErrorFunc;

    bool ok = kvFile.loadFromFile(combinedFileName.c_str());

    if (ok)
      for (auto && value : kvFile.kv)
        kv.push_back(value);

    return ok;
  }